

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# libj1939.c
# Opt level: O0

void libj1939_parse_canaddr(char *spec,sockaddr_can *paddr)

{
  uint uVar1;
  char *pcVar2;
  size_t sVar3;
  ulong uVar4;
  ulonglong uVar5;
  long in_RSI;
  char *str;
  char *local_8;
  
  pcVar2 = strsep(&local_8,":");
  sVar3 = strlen(pcVar2);
  if (sVar3 != 0) {
    uVar1 = if_nametoindex(pcVar2);
    *(uint *)(in_RSI + 4) = uVar1;
  }
  pcVar2 = strsep(&local_8,",");
  if (pcVar2 != (char *)0x0) {
    sVar3 = strlen(pcVar2);
    if (sVar3 != 0) {
      uVar4 = strtoul(pcVar2,(char **)0x0,0);
      *(char *)(in_RSI + 0x14) = (char)uVar4;
    }
  }
  pcVar2 = strsep(&local_8,",");
  if (pcVar2 != (char *)0x0) {
    sVar3 = strlen(pcVar2);
    if (sVar3 != 0) {
      uVar4 = strtoul(pcVar2,(char **)0x0,0);
      *(int *)(in_RSI + 0x10) = (int)uVar4;
    }
  }
  pcVar2 = strsep(&local_8,",");
  if (pcVar2 != (char *)0x0) {
    sVar3 = strlen(pcVar2);
    if (sVar3 != 0) {
      uVar5 = strtoull(pcVar2,(char **)0x0,0);
      *(ulonglong *)(in_RSI + 8) = uVar5;
    }
  }
  return;
}

Assistant:

void libj1939_parse_canaddr(char *spec, struct sockaddr_can *paddr)
{
	char *str;

	str = strsep(&spec, ":");
	if (strlen(str))
		paddr->can_ifindex = if_nametoindex(str);

	str = strsep(&spec, ",");
	if (str && strlen(str))
		paddr->can_addr.j1939.addr = strtoul(str, NULL, 0);

	str = strsep(&spec, ",");
	if (str && strlen(str))
		paddr->can_addr.j1939.pgn = strtoul(str, NULL, 0);

	str = strsep(&spec, ",");
	if (str && strlen(str))
		paddr->can_addr.j1939.name = strtoull(str, NULL, 0);
}